

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

lyxml_ns * lyxml_get_ns(lyxml_elem *elem,char *prefix)

{
  lyxml_attr *plVar1;
  int iVar2;
  lyxml_attr **pplVar3;
  
  do {
    if (elem == (lyxml_elem *)0x0) {
      return (lyxml_ns *)0x0;
    }
    pplVar3 = &elem->attr;
    while (plVar1 = *pplVar3, plVar1 != (lyxml_attr *)0x0) {
      if (plVar1->type == LYXML_ATTR_NS) {
        if (plVar1->name == (char *)0x0) {
          if (prefix == (char *)0x0) {
            if (plVar1->value != (char *)0x0) {
              return (lyxml_ns *)plVar1;
            }
            return (lyxml_ns *)0x0;
          }
        }
        else if ((prefix != (char *)0x0) && (iVar2 = strcmp(plVar1->name,prefix), iVar2 == 0)) {
          return (lyxml_ns *)plVar1;
        }
      }
      pplVar3 = &plVar1->next;
    }
    elem = elem->parent;
  } while( true );
}

Assistant:

lyxml_ns *
lyxml_get_ns(const struct lyxml_elem *elem, const char *prefix)
{
    struct lyxml_attr *attr;

    if (!elem) {
        return NULL;
    }

    for (attr = elem->attr; attr; attr = attr->next) {
        if (attr->type != LYXML_ATTR_NS) {
            continue;
        }
        if (!attr->name) {
            if (!prefix) {
                /* default namespace found */
                if (!attr->value) {
                    /* empty default namespace -> no default namespace */
                    return NULL;
                }
                return (struct lyxml_ns *)attr;
            }
        } else if (prefix && !strcmp(attr->name, prefix)) {
            /* prefix found */
            return (struct lyxml_ns *)attr;
        }
    }

    /* go recursively */
    return lyxml_get_ns(elem->parent, prefix);
}